

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_notation.cpp
# Opt level: O0

void __thiscall
icu_63::number::ScientificNotation::ScientificNotation
          (ScientificNotation *this,int8_t fEngineeringInterval,bool fRequireMinInt,
          digits_t fMinExponentDigits,UNumberSignDisplay fExponentSignDisplay)

{
  NotationType local_38;
  Notation local_34;
  NotationUnion local_28;
  NotationUnion union_;
  ScientificSettings settings;
  UNumberSignDisplay fExponentSignDisplay_local;
  digits_t fMinExponentDigits_local;
  bool fRequireMinInt_local;
  int8_t fEngineeringInterval_local;
  ScientificNotation *this_local;
  
  settings._0_4_ = fExponentSignDisplay;
  settings.fExponentSignDisplay._0_2_ = fMinExponentDigits;
  settings.fExponentSignDisplay._2_1_ = fRequireMinInt;
  settings.fExponentSignDisplay._3_1_ = fEngineeringInterval;
  number::Notation::Notation(&this->super_Notation);
  union_.scientific.fEngineeringInterval = settings.fExponentSignDisplay._3_1_;
  union_.scientific.fRequireMinInt = (bool)(settings.fExponentSignDisplay._2_1_ & 1);
  union_.scientific.fMinExponentDigits = (undefined2)settings.fExponentSignDisplay;
  union_._4_1_ = settings.fEngineeringInterval;
  union_._5_1_ = settings.fRequireMinInt;
  union_._6_2_ = settings.fMinExponentDigits;
  local_28 = (NotationUnion)
             (CONCAT44(settings._0_4_,
                       CONCAT22((undefined2)settings.fExponentSignDisplay,
                                CONCAT11(settings.fExponentSignDisplay._2_1_,
                                         settings.fExponentSignDisplay._3_1_))) & 0xffffffffffff01ff
             );
  local_38 = NTN_SCIENTIFIC;
  Notation((ScientificNotation *)&local_34,&local_38,&local_28);
  *(undefined8 *)&this->super_Notation = local_34._0_8_;
  (this->super_Notation).fUnion.scientific.fExponentSignDisplay =
       local_34.fUnion.scientific.fExponentSignDisplay;
  return;
}

Assistant:

ScientificNotation::ScientificNotation(int8_t fEngineeringInterval, bool fRequireMinInt,
                                       impl::digits_t fMinExponentDigits,
                                       UNumberSignDisplay fExponentSignDisplay) {
    ScientificSettings settings;
    settings.fEngineeringInterval = fEngineeringInterval;
    settings.fRequireMinInt = fRequireMinInt;
    settings.fMinExponentDigits = fMinExponentDigits;
    settings.fExponentSignDisplay = fExponentSignDisplay;
    NotationUnion union_;
    union_.scientific = settings;
    *this = {NTN_SCIENTIFIC, union_};
}